

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

Message * __thiscall google::protobuf::MapValueConstRef::GetMessageValue(MapValueConstRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessageFatal aLStack_38 [16];
  char *local_28;
  char *local_20;
  
  CVar1 = type(this);
  if (CVar1 == CPPTYPE_MESSAGE) {
    return (Message *)this->data_;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map_field.h"
             ,0x30f);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     ((LogMessage *)aLStack_38,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [34])"MapValueConstRef::GetMessageValue");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [22])" type does not match\n");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Expected : ");
  local_20 = (char *)0x3cf755;
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,&local_20);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x30a47e);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Actual   : ");
  CVar1 = type(this);
  local_28 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8);
  absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>(pLVar2,&local_28);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
}

Assistant:

const Message& GetMessageValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_MESSAGE,
               "MapValueConstRef::GetMessageValue");
    return *reinterpret_cast<Message*>(data_);
  }